

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_undo_update_pfx_table_batch
              (rtr_socket *rtr_socket,pfx_table *pfx_table,pdu_ipv4 *ipv4_pdus,size_t ipv4_pdu_count
              ,pdu_ipv6 *ipv6_pdus,size_t ipv6_pdu_count)

{
  long lVar1;
  int iVar2;
  pdu_ipv4 *pdu;
  pdu_ipv6 *pdu_00;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = ipv4_pdu_count != 0;
  if (bVar4) {
    iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,ipv4_pdus);
    if (iVar2 != -1) {
      pdu = ipv4_pdus + 1;
      uVar3 = 0;
      do {
        if (ipv4_pdu_count - 1 == uVar3) goto LAB_0010b038;
        iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,pdu);
        pdu = pdu + 1;
        uVar3 = uVar3 + 1;
      } while (iVar2 != -1);
      bVar4 = uVar3 < ipv4_pdu_count;
    }
    lrtr_dbg(
            "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all prefix records"
            );
    pfx_table_src_remove(pfx_table,rtr_socket);
    iVar2 = -1;
    if (bVar4) goto LAB_0010b0af;
  }
LAB_0010b038:
  bVar4 = ipv6_pdu_count != 0;
  if (bVar4) {
    iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,ipv6_pdus);
    if (iVar2 != -1) {
      pdu_00 = ipv6_pdus + 1;
      uVar3 = 0;
      do {
        if (ipv6_pdu_count - 1 == uVar3) {
          bVar4 = false;
          goto LAB_0010b0a9;
        }
        iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,pdu_00);
        pdu_00 = pdu_00 + 1;
        uVar3 = uVar3 + 1;
      } while (iVar2 != -1);
      bVar4 = uVar3 < ipv6_pdu_count;
    }
    lrtr_dbg(
            "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all prefix records"
            );
    pfx_table_src_remove(pfx_table,rtr_socket);
  }
LAB_0010b0a9:
  iVar2 = -(uint)bVar4;
LAB_0010b0af:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_undo_update_pfx_table_batch(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table,
					   struct pdu_ipv4 *ipv4_pdus, size_t ipv4_pdu_count,
					   struct pdu_ipv6 *ipv6_pdus, size_t ipv6_pdu_count)
{
	for (size_t i = 0; i < ipv4_pdu_count; i++) {
		int res = rtr_undo_update_pfx_table(rtr_socket, pfx_table, &(ipv4_pdus[i]));

		if (res == RTR_ERROR || res == PFX_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all prefix records");
			pfx_table_src_remove(pfx_table, rtr_socket);
			return RTR_ERROR;
		}
	}

	for (size_t i = 0; i < ipv6_pdu_count; i++) {
		int res = rtr_undo_update_pfx_table(rtr_socket, pfx_table, &(ipv6_pdus[i]));

		if (res == RTR_ERROR || res == PFX_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all prefix records");
			pfx_table_src_remove(pfx_table, rtr_socket);
			return RTR_ERROR;
		}
	}
	return RTR_SUCCESS;
}